

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_topointer(lua_State *L,int idx)

{
  TValue *pTVar1;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2addr(L,idx);
  switch(pTVar1->tt_ & 0x3f) {
  case 2:
    L_local = (lua_State *)(pTVar1->value_).gc;
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 5:
    L_local = (lua_State *)(pTVar1->value_).gc;
    break;
  case 6:
    L_local = (lua_State *)(pTVar1->value_).gc;
    break;
  case 7:
    L_local = (lua_State *)((pTVar1->value_).f + 0x28);
    break;
  case 8:
    L_local = (lua_State *)(pTVar1->value_).gc;
    break;
  case 0x16:
    L_local = (lua_State *)(pTVar1->value_).gc;
    break;
  case 0x26:
    L_local = (lua_State *)(pTVar1->value_).gc;
  }
  return L_local;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TTABLE: return hvalue(o);
    case LUA_TLCL: return clLvalue(o);
    case LUA_TCCL: return clCvalue(o);
    case LUA_TLCF: return cast(void *, cast(size_t, fvalue(o)));
    case LUA_TTHREAD: return thvalue(o);
    case LUA_TUSERDATA: return getudatamem(uvalue(o));
    case LUA_TLIGHTUSERDATA: return pvalue(o);
    default: return NULL;
  }
}